

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_build_polygon_boundaries.cc
# Opt level: O0

void s2shapeutil::BuildPolygonBoundaries
               (vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                *components,
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               *polygons)

{
  undefined1 *this;
  S2Shape *shape;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference this_00;
  reference ppSVar5;
  ostream *poVar6;
  reference ppSVar7;
  reference pvVar8;
  reference ppSVar9;
  reference pvVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  pointer ppVar13;
  reference this_01;
  iterator iVar14;
  iterator iVar15;
  byte local_339;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *ptr;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  *__range1;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *local_2f0;
  int local_2e8;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  local_2e0;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_const_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_const_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
  local_2d0;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *local_2c0;
  int local_2b8;
  undefined1 local_2b0 [8];
  iterator itr;
  S2Shape *loop_2;
  value_type *polygon;
  int i_3;
  S2LogMessageVoidify local_272;
  byte local_271;
  S2LogMessage local_270;
  S2LogMessageVoidify local_259;
  S2Shape *local_258;
  S2Shape *candidate;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  S2Shape *pSStack_230;
  int depth;
  S2Shape *ancestor;
  undefined1 local_220 [4];
  int i_2;
  btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
  children;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> local_1d8;
  byte local_1b9;
  S2LogMessage local_1b8;
  S2LogMessageVoidify local_1a1;
  value_type local_1a0;
  value_type loop_1;
  int i_1;
  S2ContainsPointQuery<MutableS2ShapeIndex> contains_query;
  undefined1 local_138 [8];
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ancestors;
  S2LogMessage local_118;
  S2LogMessageVoidify local_101;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> local_100 [3];
  S2Point local_e8;
  S2Shape *local_d0;
  S2Shape *loop;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  value_type *component;
  undefined1 local_a0 [4];
  int i;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> outer_loops;
  vector<int,_std::allocator<int>_> component_ids;
  MutableS2ShapeIndex index;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *polygons_local;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *components_local;
  
  std::
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ::clear(polygons);
  bVar1 = std::
          vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
          ::empty(components);
  if (!bVar1) {
    MutableS2ShapeIndex::MutableS2ShapeIndex
              ((MutableS2ShapeIndex *)
               &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::vector
              ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0);
    for (component._4_4_ = 0; uVar3 = (ulong)component._4_4_,
        sVar4 = std::
                vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                ::size(components), uVar3 < sVar4; component._4_4_ = component._4_4_ + 1) {
      this_00 = std::
                vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                ::operator[](components,(long)component._4_4_);
      __end2 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::begin(this_00);
      loop = (S2Shape *)std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<S2Shape_*const_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>
                                         *)&loop), bVar1) {
        ppSVar5 = __gnu_cxx::
                  __normal_iterator<S2Shape_*const_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>
                  ::operator*(&__end2);
        local_d0 = *ppSVar5;
        sVar4 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size(this_00);
        shape = local_d0;
        local_339 = 0;
        if (1 < sVar4) {
          S2::Origin();
          bVar1 = ContainsBruteForce(shape,&local_e8);
          local_339 = bVar1 ^ 0xff;
        }
        if ((local_339 & 1) == 0) {
          std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back
                    ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0,&local_d0);
        }
        else {
          absl::WrapUnique<S2Shape>((absl *)local_100,local_d0);
          MutableS2ShapeIndex::Add
                    ((MutableS2ShapeIndex *)
                     &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,local_100);
          std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::~unique_ptr(local_100);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     &outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (value_type_conflict1 *)((long)&component + 4));
        }
        __gnu_cxx::
        __normal_iterator<S2Shape_*const_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>::
        operator++(&__end2);
      }
      iVar2 = component._4_4_ + 1;
      sVar4 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size
                        ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0);
      ancestors.
      super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      if ((long)iVar2 != sVar4) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_118,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                   ,0x4b,kFatal,(ostream *)&std::cerr);
        ancestors.
        super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        poVar6 = S2LogMessage::stream(&local_118);
        poVar6 = std::operator<<(poVar6,"Check failed: (i + 1) == (outer_loops.size()) ");
        poVar6 = std::operator<<(poVar6,"Component is not a subdivision");
        S2LogMessageVoidify::operator&(&local_101,poVar6);
      }
      if ((ancestors.
           super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_118);
      }
    }
    sVar4 = std::
            vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
            ::size(components);
    this = &contains_query.it_.end_.field_0xf;
    std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>::allocator
              ((allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *)this);
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::vector((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
              *)local_138,sVar4,(allocator_type *)this);
    std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>::~allocator
              ((allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_> *)
               &contains_query.it_.end_.field_0xf);
    S2ContainsPointQueryOptions::S2ContainsPointQueryOptions
              ((S2ContainsPointQueryOptions *)((long)&loop_1 + 4));
    MakeS2ContainsPointQuery<MutableS2ShapeIndex>
              ((S2ContainsPointQuery<MutableS2ShapeIndex> *)&i_1,
               (MutableS2ShapeIndex *)
               &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (S2ContainsPointQueryOptions *)((long)&loop_1 + 4));
    for (loop_1._0_4_ = 0; uVar3 = (ulong)(int)loop_1,
        sVar4 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size
                          ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0), uVar3 < sVar4
        ; loop_1._0_4_ = (int)loop_1 + 1) {
      ppSVar7 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator[]
                          ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0,
                           (long)(int)loop_1);
      local_1a0 = *ppSVar7;
      local_1b9 = 0;
      iVar2 = (*local_1a0->_vptr_S2Shape[2])();
      if (iVar2 < 1) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                   ,0x52,kFatal,(ostream *)&std::cerr);
        local_1b9 = 1;
        poVar6 = S2LogMessage::stream(&local_1b8);
        poVar6 = std::operator<<(poVar6,"Check failed: (loop->num_edges()) > (0) ");
        S2LogMessageVoidify::operator&(&local_1a1,poVar6);
      }
      if ((local_1b9 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_1b8);
      }
      (*local_1a0->_vptr_S2Shape[3])
                (&children.
                  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .
                  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .tree_.size_,local_1a0,0);
      S2ContainsPointQuery<MutableS2ShapeIndex>::GetContainingShapes
                (&local_1d8,(S2ContainsPointQuery<MutableS2ShapeIndex> *)&i_1,
                 (S2Point *)
                 &children.
                  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .
                  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .
                  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                  .tree_.size_);
      pvVar8 = std::
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               ::operator[]((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                             *)local_138,(long)(int)loop_1);
      std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=(pvVar8,&local_1d8);
      std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::~vector(&local_1d8);
    }
    gtl::
    btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
    ::btree_map((btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
                 *)local_220);
    for (ancestor._4_4_ = 0; uVar3 = (ulong)ancestor._4_4_,
        sVar4 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size
                          ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0), uVar3 < sVar4
        ; ancestor._4_4_ = ancestor._4_4_ + 1) {
      pSStack_230 = (S2Shape *)0x0;
      pvVar8 = std::
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               ::operator[]((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                             *)local_138,(long)ancestor._4_4_);
      sVar4 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size(pvVar8);
      if (0 < (int)sVar4) {
        pvVar8 = std::
                 vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                 ::operator[]((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                               *)local_138,(long)ancestor._4_4_);
        __end3 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::begin(pvVar8);
        candidate = (S2Shape *)std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::end(pvVar8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<S2Shape_**,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>
                                           *)&candidate), bVar1) {
          ppSVar9 = __gnu_cxx::
                    __normal_iterator<S2Shape_**,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>
                    ::operator*(&__end3);
          local_258 = *ppSVar9;
          iVar2 = S2Shape::id(local_258);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &outer_loops.
                                super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)iVar2);
          pvVar8 = std::
                   vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                   ::operator[]((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                                 *)local_138,(long)*pvVar10);
          sVar11 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::size(pvVar8);
          if (sVar11 == (long)((int)sVar4 + -1)) {
            local_271 = 0;
            if (pSStack_230 != (S2Shape *)0x0) {
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_270,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                         ,0x5e,kFatal,(ostream *)&std::cerr);
              local_271 = 1;
              poVar6 = S2LogMessage::stream(&local_270);
              poVar6 = std::operator<<(poVar6,"Check failed: ancestor == nullptr ");
              S2LogMessageVoidify::operator&(&local_259,poVar6);
            }
            if ((local_271 & 1) != 0) {
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_270);
            }
            pSStack_230 = local_258;
          }
          __gnu_cxx::
          __normal_iterator<S2Shape_**,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>::
          operator++(&__end3);
        }
        if (pSStack_230 == (S2Shape *)0x0) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&i_3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                     ,0x62,kFatal,(ostream *)&std::cerr);
          poVar6 = S2LogMessage::stream((S2LogMessage *)&i_3);
          poVar6 = std::operator<<(poVar6,"Check failed: ancestor != nullptr ");
          S2LogMessageVoidify::operator&(&local_272,poVar6);
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&i_3);
        }
      }
      pmVar12 = gtl::internal_btree::
                btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                              *)local_220,&stack0xfffffffffffffdd0);
      ppSVar7 = std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator[]
                          ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0,
                           (long)ancestor._4_4_);
      std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back(pmVar12,ppSVar7);
    }
    iVar2 = MutableS2ShapeIndex::num_shape_ids
                      ((MutableS2ShapeIndex *)
                       &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::resize(polygons,(long)(iVar2 + 1));
    for (polygon._0_4_ = 0;
        iVar2 = MutableS2ShapeIndex::num_shape_ids
                          ((MutableS2ShapeIndex *)
                           &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), (int)polygon < iVar2;
        polygon._0_4_ = (int)polygon + 1) {
      pvVar8 = std::
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               ::operator[](polygons,(long)(int)polygon);
      itr._8_8_ = MutableS2ShapeIndex::shape
                            ((MutableS2ShapeIndex *)
                             &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(int)polygon);
      iVar14 = gtl::internal_btree::
               btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>>
               ::find<S2Shape*>((btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>>
                                 *)local_220,(S2Shape **)&itr.position);
      local_2c0 = iVar14.node;
      local_2b8 = iVar14.position;
      local_2b0 = (undefined1  [8])local_2c0;
      itr.node._0_4_ = local_2b8;
      iVar15 = gtl::internal_btree::
               btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
               ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                      *)local_220);
      local_2f0 = iVar15.node;
      local_2e8 = iVar15.position;
      local_2e0.node = local_2f0;
      local_2e0.position = local_2e8;
      gtl::internal_btree::
      btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_const_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_const_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
      ::
      btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*,_0>
                (&local_2d0,&local_2e0);
      bVar1 = gtl::internal_btree::
              btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
              ::operator!=((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                            *)local_2b0,&local_2d0);
      if (bVar1) {
        ppVar13 = gtl::internal_btree::
                  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                  ::operator->((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                                *)local_2b0);
        std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=(pvVar8,&ppVar13->second);
      }
      std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back
                (pvVar8,(value_type *)&itr.position);
    }
    __range1 = (vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                *)0x0;
    pmVar12 = gtl::internal_btree::
              btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
              ::operator[]((btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                            *)local_220,(key_type *)&__range1);
    pvVar8 = std::
             vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
             ::back(polygons);
    std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=(pvVar8,pmVar12);
    MutableS2ShapeIndex::ReleaseAll
              ((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                *)&__begin1,
               (MutableS2ShapeIndex *)
               &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    __end1 = std::
             vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
             ::begin((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                      *)&__begin1);
    ptr = (unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)
          std::
          vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
          ::end((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                 *)&__begin1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_*,_std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>_>
                                       *)&ptr), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_*,_std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>_>
                ::operator*(&__end1);
      std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>::release(this_01);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_*,_std::vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>_>
      ::operator++(&__end1);
    }
    std::
    vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
    ::~vector((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
               *)&__begin1);
    gtl::
    btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
    ::~btree_map((btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
                  *)local_220);
    S2ContainsPointQuery<MutableS2ShapeIndex>::~S2ContainsPointQuery
              ((S2ContainsPointQuery<MutableS2ShapeIndex> *)&i_1);
    std::
    vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ::~vector((vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               *)local_138);
    std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::~vector
              ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)local_a0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               &outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    MutableS2ShapeIndex::~MutableS2ShapeIndex
              ((MutableS2ShapeIndex *)
               &component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void BuildPolygonBoundaries(const vector<vector<S2Shape*>>& components,
                            vector<vector<S2Shape*>>* polygons) {
  polygons->clear();
  if (components.empty()) return;

  // Since the loop boundaries do not cross, a loop nesting hierarchy can be
  // defined by choosing any point on the sphere as the "point at infinity".
  // Loop A then contains loop B if (1) A contains the boundary of B and (2)
  // loop A does not contain the point at infinity.
  //
  // We choose S2::Origin() for this purpose.  The loop nesting hierarchy then
  // determines the face structure.  Here are the details:
  //
  // 1. Build an S2ShapeIndex of all loops that do not contain S2::Origin().
  //    This leaves at most one unindexed loop per connected component
  //    (the "outer loop").
  //
  // 2. For each component, choose a representative vertex and determine
  //    which indexed loops contain it.  The "depth" of this component is
  //    defined as the number of such loops.
  //
  // 3. Assign the outer loop of each component to the containing loop whose
  //    depth is one less.  This generates a set of multi-loop polygons.
  //
  // 4. The outer loops of all components at depth 0 become a single face.

  MutableS2ShapeIndex index;
  // A map from shape.id() to the corresponding component number.
  vector<int> component_ids;
  vector<S2Shape*> outer_loops;
  for (int i = 0; i < components.size(); ++i) {
    const auto& component = components[i];
    for (S2Shape* loop : component) {
      if (component.size() > 1 &&
          !s2shapeutil::ContainsBruteForce(*loop, S2::Origin())) {
        // Ownership is transferred back at the end of this function.
        index.Add(WrapUnique(loop));
        component_ids.push_back(i);
      } else {
        outer_loops.push_back(loop);
      }
    }
    // Check that there is exactly one outer loop in each component.
    S2_DCHECK_EQ(i + 1, outer_loops.size()) << "Component is not a subdivision";
  }
  // Find the loops containing each component.
  vector<vector<S2Shape*>> ancestors(components.size());
  auto contains_query = MakeS2ContainsPointQuery(&index);
  for (int i = 0; i < outer_loops.size(); ++i) {
    auto loop = outer_loops[i];
    S2_DCHECK_GT(loop->num_edges(), 0);
    ancestors[i] = contains_query.GetContainingShapes(loop->edge(0).v0);
  }
  // Assign each outer loop to the component whose depth is one less.
  // Components at depth 0 become a single face.
  gtl::btree_map<S2Shape*, vector<S2Shape*>> children;
  for (int i = 0; i < outer_loops.size(); ++i) {
    S2Shape* ancestor = nullptr;
    int depth = ancestors[i].size();
    if (depth > 0) {
      for (auto candidate : ancestors[i]) {
        if (ancestors[component_ids[candidate->id()]].size() == depth - 1) {
          S2_DCHECK(ancestor == nullptr);
          ancestor = candidate;
        }
      }
      S2_DCHECK(ancestor != nullptr);
    }
    children[ancestor].push_back(outer_loops[i]);
  }
  // There is one face per loop that is not an outer loop, plus one for the
  // outer loops of components at depth 0.
  polygons->resize(index.num_shape_ids() + 1);
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    auto polygon = &(*polygons)[i];
    auto loop = index.shape(i);
    auto itr = children.find(loop);
    if (itr != children.end()) {
      *polygon = itr->second;
    }
    polygon->push_back(loop);
  }
  polygons->back() = children[nullptr];

  // Explicitly release the shapes from the index so they are not deleted.
  for (auto& ptr : index.ReleaseAll()) ptr.release();
}